

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HModel.cpp
# Opt level: O0

void __thiscall HModel::copy_fromHPresolveToHModelImplied(HModel *this,HPresolve *ptr_model)

{
  long in_RDI;
  vector<double,_std::allocator<double>_> *in_stack_00000088;
  vector<double,_std::allocator<double>_> *in_stack_00000090;
  
  *(undefined1 *)(in_RDI + 0x57c) = 1;
  std::vector<double,_std::allocator<double>_>::operator=(in_stack_00000090,in_stack_00000088);
  std::vector<double,_std::allocator<double>_>::operator=(in_stack_00000090,in_stack_00000088);
  std::vector<double,_std::allocator<double>_>::operator=(in_stack_00000090,in_stack_00000088);
  std::vector<double,_std::allocator<double>_>::operator=(in_stack_00000090,in_stack_00000088);
  std::vector<double,_std::allocator<double>_>::operator=(in_stack_00000090,in_stack_00000088);
  std::vector<double,_std::allocator<double>_>::operator=(in_stack_00000090,in_stack_00000088);
  std::vector<double,_std::allocator<double>_>::operator=(in_stack_00000090,in_stack_00000088);
  std::vector<double,_std::allocator<double>_>::operator=(in_stack_00000090,in_stack_00000088);
  return;
}

Assistant:

void HModel::copy_fromHPresolveToHModelImplied(HPresolve* ptr_model) {
    impliedBoundsPresolve = true;
    primalColLowerImplied = ptr_model->implColLower;
    primalColUpperImplied = ptr_model->implColUpper;
    dualColLowerImplied = ptr_model->implColDualLower;
    dualColUpperImplied = ptr_model->implColDualUpper;
    primalRowLowerImplied = ptr_model->implRowValueLower;
    primalRowUpperImplied = ptr_model->implRowValueUpper;
    dualRowLowerImplied = ptr_model->implRowDualLower;
    dualRowUpperImplied = ptr_model->implRowDualUpper;
}